

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

mraa_gpio_context mraa_gpio_init_multi(int *pins,int num_pins)

{
  mraa_gpio_context p_Var1;
  mraa_gpio_context p_Var2;
  int local_44;
  int i;
  mraa_gpio_context tmp;
  mraa_gpio_context current;
  mraa_gpio_context head;
  mraa_board_t *board;
  int num_pins_local;
  int *pins_local;
  
  if (plat == (mraa_board_t *)0x0) {
    syslog(3,"[GPIOD_INTERFACE]: init: platform not initialised");
    pins_local = (int *)0x0;
  }
  else if (plat->chardev_capable == 0) {
    current = (mraa_gpio_context)0x0;
    for (local_44 = 0; local_44 < num_pins; local_44 = local_44 + 1) {
      p_Var2 = mraa_gpio_init(pins[local_44]);
      if (p_Var2 == (mraa_gpio_context)0x0) {
        syslog(3,"mraa_gpio_init_multi() error initializing pin %i",(ulong)(uint)pins[local_44]);
      }
      else {
        p_Var1 = p_Var2;
        if (current != (mraa_gpio_context)0x0) {
          tmp->next = p_Var2;
          p_Var1 = current;
        }
        current = p_Var1;
        p_Var2->next = (_gpio *)0x0;
        tmp = p_Var2;
      }
    }
    if (current != (mraa_gpio_context)0x0) {
      current->num_pins = num_pins;
    }
    pins_local = &current->pin;
  }
  else {
    pins_local = &mraa_gpio_chardev_init(pins,num_pins)->pin;
  }
  return (mraa_gpio_context)pins_local;
}

Assistant:

mraa_gpio_context
mraa_gpio_init_multi(int pins[], int num_pins)
{
    mraa_board_t* board = plat;

    if (board == NULL) {
        syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: platform not initialised");
        return NULL;
    }

    if (board->chardev_capable)
        return mraa_gpio_chardev_init(pins, num_pins);

    /* Fallback to legacy interface. */
    mraa_gpio_context head = NULL, current, tmp;

    for (int i = 0; i < num_pins; ++i) {
        tmp = mraa_gpio_init(pins[i]);
        if (!tmp) {
            syslog(LOG_ERR, "mraa_gpio_init_multi() error initializing pin %i", pins[i]);
            continue;
        }

        if (head == NULL) {
            head = tmp;
            current = tmp;
        } else {
            current->next = tmp;
            current = tmp;
        }

        current->next = NULL;
    }

    if (head != NULL) {
        head->num_pins = num_pins;
    }

    return head;
}